

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O2

void __thiscall
libcellml::Annotator::AnnotatorImpl::addIssueNonUnique(AnnotatorImpl *this,string *id)

{
  IssueImpl *this_00;
  size_type __val;
  IssuePtr issue;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  Issue::IssueImpl::create();
  this_00 = (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->mPimpl;
  std::operator+(&local_98,"The identifier \'",id);
  std::operator+(&local_78,&local_98,"\' occurs ");
  __val = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>_>_>
          ::count(&(this->mIdList)._M_t,id);
  std::__cxx11::to_string(&local_b8,__val);
  std::operator+(&local_58,&local_78,&local_b8);
  std::operator+(&local_38,&local_58," times in the model so a unique item cannot be located.");
  Issue::IssueImpl::setDescription(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  Issue::IssueImpl::setLevel
            ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->mPimpl
             ,WARNING);
  Issue::IssueImpl::setReferenceRule
            ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->mPimpl
             ,ANNOTATOR_ID_NOT_UNIQUE);
  Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void Annotator::AnnotatorImpl::addIssueNonUnique(const std::string &id)
{
    auto issue = Issue::IssueImpl::create();
    issue->mPimpl->setDescription("The identifier '" + id + "' occurs " + std::to_string(mIdList.count(id)) + " times in the model so a unique item cannot be located.");
    issue->mPimpl->setLevel(Issue::Level::WARNING);
    issue->mPimpl->setReferenceRule(Issue::ReferenceRule::ANNOTATOR_ID_NOT_UNIQUE);
    addIssue(issue);
}